

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  char cVar1;
  int iVar2;
  Station *pSVar3;
  EvaluationFunction *ev;
  ostream *poVar4;
  difference_type __d;
  int iVar5;
  int i_1;
  long lVar6;
  ulong uVar7;
  int i;
  bool bVar8;
  double dVar9;
  initializer_list<args::EitherFlag> in;
  initializer_list<double> __l;
  initializer_list<double> __l_00;
  initializer_list<double> __l_01;
  double local_6f0;
  int local_6d4;
  vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  coord_files;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  organ_files;
  iterator it;
  vector<double,_std::allocator<double>_> Zmax;
  vector<double,_std::allocator<double>_> Zmin;
  set<std::pair<std::pair<double,_bool>,_std::pair<imrt::Station_*,_int>_>,_std::greater<std::pair<std::pair<double,_bool>,_std::pair<imrt::Station_*,_int>_>_>,_std::allocator<std::pair<std::pair<double,_bool>,_std::pair<imrt::Station_*,_int>_>_>_>
  sb;
  vector<double,_std::allocator<double>_> w;
  vector<imrt::Station_*,_std::allocator<imrt::Station_*>_> stations;
  vector<imrt::Volume,_std::allocator<imrt::Volume>_> volumes;
  list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> diff;
  string file;
  Plan P;
  Collimator collimator;
  Positional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_args::ValueReader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  _file;
  string local_2a8;
  ArgumentParser parser;
  HelpFlag help;
  
  std::__cxx11::string::string
            ((string *)&collimator,"********* IMRT-Solver *********",(allocator *)&help);
  std::__cxx11::string::string((string *)&P,"An IMRT Solver.",(allocator *)&_file);
  args::ArgumentParser::ArgumentParser(&parser,(string *)&collimator,(string *)&P);
  std::__cxx11::string::~string((string *)&P);
  std::__cxx11::string::~string((string *)&collimator);
  std::__cxx11::string::string((string *)&_file,"help",(allocator *)&file);
  std::__cxx11::string::string((string *)&sb,"Display this help menu",(allocator *)&coord_files);
  P.angle2station._M_t._M_impl._0_8_ =
       &P.angle2station._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  P._vptr_Plan._0_2_ = 0x6801;
  P.angle2station._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  P.angle2station._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  P.angle2station._M_t._M_impl.super__Rb_tree_header._M_header._M_parent._0_1_ = 0;
  args::EitherFlag::EitherFlag
            ((EitherFlag *)&P.angle2station._M_t._M_impl.super__Rb_tree_header._M_header._M_right,
             "help");
  in._M_len = 2;
  in._M_array = (iterator)&P;
  args::Matcher::Matcher((Matcher *)&collimator,in);
  args::HelpFlag::HelpFlag
            (&help,&parser.super_Group,(string *)&_file,(string *)&sb,(Matcher *)&collimator);
  args::Matcher::~Matcher((Matcher *)&collimator);
  lVar6 = 0x30;
  do {
    std::__cxx11::string::~string((string *)((long)&P._vptr_Plan + lVar6));
    lVar6 = lVar6 + -0x28;
  } while (lVar6 != -0x20);
  std::__cxx11::string::~string((string *)&sb);
  std::__cxx11::string::~string((string *)&_file);
  std::__cxx11::string::string((string *)&collimator,"instance",(allocator *)&file);
  std::__cxx11::string::string((string *)&P,"Instance",(allocator *)&coord_files);
  sb._M_t._M_impl._0_8_ = &sb._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  sb._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  sb._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  sb._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)
       ((ulong)sb._M_t._M_impl.super__Rb_tree_header._M_header._M_parent & 0xffffffffffffff00);
  args::
  Positional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_args::ValueReader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::Positional(&_file,&parser.super_Group,(string *)&collimator,(string *)&P,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&sb);
  std::__cxx11::string::~string((string *)&sb);
  std::__cxx11::string::~string((string *)&P);
  std::__cxx11::string::~string((string *)&collimator);
  args::ArgumentParser::ParseCLI(&parser,argc,argv);
  std::__cxx11::string::string((string *)&file,(string *)&_file.value);
  std::
  vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::vector(&coord_files,5,(allocator_type *)&collimator);
  collimator.beam_coord._M_t._M_impl._0_4_ = 0;
  collimator.beam_coord._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = anon_var_dwarf_131a0;
  std::pair<int,std::__cxx11::string>::operator=
            ((pair<int,std::__cxx11::string> *)
             coord_files.
             super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start,(pair<int,_const_char_*> *)&collimator);
  collimator.beam_coord._M_t._M_impl._0_4_ = 0x46;
  collimator.beam_coord._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = anon_var_dwarf_131b9;
  std::pair<int,std::__cxx11::string>::operator=
            ((pair<int,std::__cxx11::string> *)
             (coord_files.
              super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start + 1),(pair<int,_const_char_*> *)&collimator)
  ;
  collimator.beam_coord._M_t._M_impl._0_4_ = 0x8c;
  collimator.beam_coord._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = anon_var_dwarf_131d2;
  std::pair<int,std::__cxx11::string>::operator=
            ((pair<int,std::__cxx11::string> *)
             (coord_files.
              super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start + 2),(pair<int,_const_char_*> *)&collimator)
  ;
  collimator.beam_coord._M_t._M_impl._0_4_ = 0xd2;
  collimator.beam_coord._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = anon_var_dwarf_131eb;
  std::pair<int,std::__cxx11::string>::operator=
            ((pair<int,std::__cxx11::string> *)
             (coord_files.
              super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start + 3),(pair<int,_const_char_*> *)&collimator)
  ;
  collimator.beam_coord._M_t._M_impl._0_4_ = 0x118;
  collimator.beam_coord._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = anon_var_dwarf_131f6;
  std::pair<int,std::__cxx11::string>::operator=
            ((pair<int,std::__cxx11::string> *)
             (coord_files.
              super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start + 4),(pair<int,_const_char_*> *)&collimator)
  ;
  organ_files.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  organ_files.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  organ_files.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string
            ((string *)&collimator,"data/CERR_Prostate/DAO_DDM_BLADDER.dat",(allocator *)&P);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&organ_files,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&collimator);
  std::__cxx11::string::~string((string *)&collimator);
  std::__cxx11::string::string
            ((string *)&collimator,"data/CERR_Prostate/DAO_DDM_RECTUM.dat",(allocator *)&P);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&organ_files,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&collimator);
  std::__cxx11::string::~string((string *)&collimator);
  std::__cxx11::string::string
            ((string *)&collimator,"data/CERR_Prostate/DAO_DDM_PTVHD.dat",(allocator *)&P);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&organ_files,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&collimator);
  std::__cxx11::string::~string((string *)&collimator);
  imrt::Collimator::Collimator(&collimator,&coord_files);
  volumes.super__Vector_base<imrt::Volume,_std::allocator<imrt::Volume>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  volumes.super__Vector_base<imrt::Volume,_std::allocator<imrt::Volume>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  volumes.super__Vector_base<imrt::Volume,_std::allocator<imrt::Volume>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  lVar6 = 0;
  for (uVar7 = 0;
      uVar7 < (ulong)((long)organ_files.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)organ_files.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 5); uVar7 = uVar7 + 1) {
    std::__cxx11::string::string
              ((string *)&local_2a8,
               (string *)
               ((long)&((organ_files.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar6));
    imrt::Volume::Volume((Volume *)&P,&collimator,&local_2a8);
    std::vector<imrt::Volume,_std::allocator<imrt::Volume>_>::emplace_back<imrt::Volume>
              (&volumes,(Volume *)&P);
    std::
    _Rb_tree<int,_std::pair<const_int,_maths::Matrix>,_std::_Select1st<std::pair<const_int,_maths::Matrix>_>,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>
    ::~_Rb_tree((_Rb_tree<int,_std::pair<const_int,_maths::Matrix>,_std::_Select1st<std::pair<const_int,_maths::Matrix>_>,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>
                 *)&P.angle2station);
    std::__cxx11::string::~string((string *)&local_2a8);
    lVar6 = lVar6 + 0x20;
  }
  std::vector<imrt::Station_*,_std::allocator<imrt::Station_*>_>::vector
            (&stations,5,(allocator_type *)&P);
  iVar5 = 0;
  for (lVar6 = 0; lVar6 != 5; lVar6 = lVar6 + 1) {
    pSVar3 = (Station *)operator_new(0x170);
    imrt::Station::Station(pSVar3,&collimator,&volumes,iVar5,4,0x1c,0,2,-1,6,(fstream *)0x0);
    imrt::Station::generateIntensity(pSVar3);
    imrt::Station::printIntensity(pSVar3,false);
    stations.super__Vector_base<imrt::Station_*,_std::allocator<imrt::Station_*>_>._M_impl.
    super__Vector_impl_data._M_start[lVar6] = pSVar3;
    iVar5 = iVar5 + 0x46;
  }
  ev = imrt::EvaluationFunction::getInstance(&volumes,&collimator);
  imrt::Plan::Plan(&P,ev);
  for (lVar6 = 0; lVar6 != 5; lVar6 = lVar6 + 1) {
    imrt::Plan::add_station
              (&P,stations.super__Vector_base<imrt::Station_*,_std::allocator<imrt::Station_*>_>.
                  _M_impl.super__Vector_impl_data._M_start[lVar6]);
  }
  sb._M_t._M_impl._0_8_ = 0x3ff0000000000000;
  sb._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  sb._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0x3ff00000;
  sb._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x3ff0000000000000;
  __l._M_len = 3;
  __l._M_array = (iterator)&sb;
  std::vector<double,_std::allocator<double>_>::vector(&w,__l,(allocator_type *)&Zmin);
  sb._M_t._M_impl._0_8_ = 0;
  sb._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  sb._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  sb._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x4051800000000000;
  __l_00._M_len = 3;
  __l_00._M_array = (iterator)&sb;
  std::vector<double,_std::allocator<double>_>::vector(&Zmin,__l_00,(allocator_type *)&Zmax);
  sb._M_t._M_impl._0_8_ = 0x4049000000000000;
  sb._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  sb._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0x40490000;
  sb._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x408f400000000000;
  __l_01._M_len = 3;
  __l_01._M_array = (iterator)&sb;
  std::vector<double,_std::allocator<double>_>::vector(&Zmax,__l_01,(allocator_type *)&diff);
  local_6f0 = imrt::EvaluationFunction::eval(ev,&P,&w,&Zmin,&Zmax);
  std::operator<<((ostream *)&std::cout,"ev:");
  poVar4 = std::ostream::_M_insert<double>(local_6f0);
  std::endl<char,std::char_traits<char>>(poVar4);
  local_6d4 = 100;
  while( true ) {
    bVar8 = local_6d4 == 0;
    local_6d4 = local_6d4 + -1;
    if (bVar8) break;
    imrt::EvaluationFunction::best_beamlets
              ((set<std::pair<std::pair<double,_bool>,_std::pair<imrt::Station_*,_int>_>,_std::greater<std::pair<std::pair<double,_bool>,_std::pair<imrt::Station_*,_int>_>_>,_std::allocator<std::pair<std::pair<double,_bool>,_std::pair<imrt::Station_*,_int>_>_>_>
                *)&sb._M_t,ev,&P,10,10,0);
    it._M_node = sb._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    iVar5 = rand();
    std::
    __advance<std::_Rb_tree_const_iterator<std::pair<std::pair<double,bool>,std::pair<imrt::Station*,int>>>,long>
              (&it,(ulong)(long)iVar5 % sb._M_t._M_impl.super__Rb_tree_header._M_node_count);
    pSVar3 = (Station *)it._M_node[1]._M_left;
    iVar5 = *(int *)&it._M_node[1]._M_right;
    cVar1 = *(char *)&it._M_node[1]._M_parent;
    iVar2 = rand();
    dVar9 = (double)(iVar2 % 3);
    if (cVar1 != '\0') {
      dVar9 = -dVar9;
    }
    iVar2 = rand();
    imrt::Station::increaseIntensity_abi_cxx11_(&diff,pSVar3,iVar5,dVar9,iVar2 % 5);
    dVar9 = imrt::EvaluationFunction::incremental_eval(ev,pSVar3,&w,&Zmin,&Zmax,&diff);
    if (dVar9 <= local_6f0) {
      poVar4 = std::ostream::_M_insert<double>(dVar9);
      std::endl<char,std::char_traits<char>>(poVar4);
      local_6f0 = dVar9;
    }
    else {
      imrt::Station::revert(pSVar3,&diff);
      imrt::EvaluationFunction::undo_last_eval(ev,&w,&Zmin,&Zmax);
    }
    std::__cxx11::_List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
    _M_clear(&diff.
              super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>);
    std::
    _Rb_tree<std::pair<std::pair<double,_bool>,_std::pair<imrt::Station_*,_int>_>,_std::pair<std::pair<double,_bool>,_std::pair<imrt::Station_*,_int>_>,_std::_Identity<std::pair<std::pair<double,_bool>,_std::pair<imrt::Station_*,_int>_>_>,_std::greater<std::pair<std::pair<double,_bool>,_std::pair<imrt::Station_*,_int>_>_>,_std::allocator<std::pair<std::pair<double,_bool>,_std::pair<imrt::Station_*,_int>_>_>_>
    ::~_Rb_tree(&sb._M_t);
  }
  for (lVar6 = 0; lVar6 != 5; lVar6 = lVar6 + 1) {
    imrt::Station::printIntensity
              (stations.super__Vector_base<imrt::Station_*,_std::allocator<imrt::Station_*>_>.
               _M_impl.super__Vector_impl_data._M_start[lVar6],false);
  }
  std::operator<<((ostream *)&std::cout,"best_eval:");
  poVar4 = std::ostream::_M_insert<double>(local_6f0);
  std::endl<char,std::char_traits<char>>(poVar4);
  dVar9 = imrt::EvaluationFunction::eval(ev,&P,&w,&Zmin,&Zmax);
  std::operator<<((ostream *)&std::cout,"ev:");
  poVar4 = std::ostream::_M_insert<double>(dVar9);
  std::endl<char,std::char_traits<char>>(poVar4);
  imrt::EvaluationFunction::generate_voxel_dose_functions(ev);
  system("python plotter/plot.py");
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&Zmax.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&Zmin.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&w.super__Vector_base<double,_std::allocator<double>_>);
  imrt::Plan::~Plan(&P);
  std::_Vector_base<imrt::Station_*,_std::allocator<imrt::Station_*>_>::~_Vector_base
            (&stations.super__Vector_base<imrt::Station_*,_std::allocator<imrt::Station_*>_>);
  std::vector<imrt::Volume,_std::allocator<imrt::Volume>_>::~vector(&volumes);
  imrt::Collimator::~Collimator(&collimator);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&organ_files);
  std::
  vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&coord_files);
  std::__cxx11::string::~string((string *)&file);
  args::
  Positional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_args::ValueReader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~Positional(&_file);
  args::FlagBase::~FlagBase((FlagBase *)&help);
  args::ArgumentParser::~ArgumentParser(&parser);
  return 0;
}

Assistant:

int main(int argc, char** argv){

	args::ArgumentParser parser("********* IMRT-Solver *********", "An IMRT Solver.");
	args::HelpFlag help(parser, "help", "Display this help menu", {'h', "help"});
	//args::ValueFlag<string> _format(parser, "string", "Format: (BR, BRw, 1C)", {'f'});
	//args::ValueFlag<double> _min_fr(parser, "double", "Minimum volume occupied by a block (proportion)", {"min_fr"});
	//args::Flag trace(parser, "trace", "Trace", {"trace"});
	args::Positional<std::string> _file(parser, "instance", "Instance");

	try
	{
		parser.ParseCLI(argc, argv);

	}
	catch (args::Help&)
	{
		std::cout << parser;
		return 0;
	}
	catch (args::ParseError& e)
	{
		std::cerr << e.what() << std::endl;
		std::cerr << parser;
		return 1;
	}
	catch (args::ValidationError& e)
	{
		std::cerr << e.what() << std::endl;
		std::cerr << parser;
		return 1;
	}

	string file=_file.Get();

	vector< pair<int, string> > coord_files(5);
	coord_files[0]=(make_pair(0,"data/CERR_Prostate/CoordinatesBeam_0.txt"));
	coord_files[1]=(make_pair(70,"data/CERR_Prostate/CoordinatesBeam_70.txt"));
	coord_files[2]=(make_pair(140,"data/CERR_Prostate/CoordinatesBeam_140.txt"));
	coord_files[3]=(make_pair(210,"data/CERR_Prostate/CoordinatesBeam_210.txt"));
	coord_files[4]=(make_pair(280,"data/CERR_Prostate/CoordinatesBeam_280.txt"));

	vector<string> organ_files;
	organ_files.push_back("data/CERR_Prostate/DAO_DDM_BLADDER.dat");
	organ_files.push_back("data/CERR_Prostate/DAO_DDM_RECTUM.dat");
	organ_files.push_back("data/CERR_Prostate/DAO_DDM_PTVHD.dat");

  	Collimator collimator(coord_files);
  //	collimator.printAxisValues();
  //	collimator.printActiveBeam();

	vector<Volume> volumes;

  for (int i=0; i<organ_files.size(); i++) {
	  volumes.push_back(Volume(collimator, organ_files[i]));
	}

   //volumes[0].print_deposition();

   vector<Station*> stations(5);
   Station* station;
   for(int i=0;i<5;i++){
	   station = new Station(collimator,volumes, i*70, 4);
	   station->generateIntensity();
	   station->printIntensity();
	   stations[i]=station;
   }

   EvaluationFunction& F = EvaluationFunction::getInstance(volumes,collimator);
   Plan P(F);
   for(int i=0;i<5;i++)
	   P.add_station(*stations[i]);


	vector<double> w={1,1,1};
	vector<double> Zmin={0,0,70};
	vector<double> Zmax={50,50,1000};

	double best_eval=F.eval(P,w,Zmin,Zmax);
	cout << "ev:" << best_eval << endl;

	for(int i=0;i<100;i++){
		auto sb=F.best_beamlets(P, 10, 10);
		auto it=sb.begin();
		std::advance(it,rand()%sb.size());

		Station*s = it->second.first; int beamlet=it->second.second;
		bool sign=it->first.second;

		//cout << eval_beamlet << endl;

		double intensity=rand()%3;
		if(sign) intensity*=-1;

		double ratio= rand()%5 ;
		//if(eval_beamlet<0) intensity=-intensity;


		auto diff=s->increaseIntensity(beamlet,intensity,ratio);
		double eval=F.incremental_eval(*s,w,Zmin,Zmax, diff);

		if(eval > best_eval){ //reject the move
			s->revert(diff);
			F.undo_last_eval(w,Zmin,Zmax);
		}else{ //accept the move
			cout << eval << endl;
			best_eval=eval;
		}
	}

	for(int i=0;i<5;i++)
		stations[i]->printIntensity();

	cout << "best_eval:" << best_eval << endl;

	best_eval=F.eval(P,w,Zmin,Zmax);
		cout << "ev:" << best_eval << endl;

  F.generate_voxel_dose_functions ();
  system("python plotter/plot.py");

	return 0;

}